

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

ConfidentialTransaction * __thiscall
cfd::core::ConfidentialTransaction::operator=
          (ConfidentialTransaction *this,ConfidentialTransaction *transaction)

{
  string local_30;
  
  if (this != transaction) {
    AbstractTransaction::GetHex_abi_cxx11_(&local_30,&transaction->super_AbstractTransaction);
    SetFromHex(this,&local_30);
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  return this;
}

Assistant:

ConfidentialTransaction &ConfidentialTransaction::operator=(
    const ConfidentialTransaction &transaction) & {
  if (this != &transaction) {
    SetFromHex(transaction.GetHex());
  }
  return *this;
}